

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::LRN_x86_avx512::forward_inplace(LRN_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  _func_int **pp_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  byte bVar17;
  byte bVar18;
  int *piVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  pointer piVar22;
  bool bVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  _func_int ***ppp_Var28;
  ulong uVar29;
  int iVar30;
  float *pfVar31;
  undefined1 (*pauVar32) [32];
  uint uVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  long lVar40;
  undefined1 (*pauVar41) [32];
  void *pvVar42;
  ushort uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  ulong local_208;
  allocator_type local_1f9;
  Mat local_1f8;
  undefined8 local_1a8;
  ulong local_1a0;
  long local_198;
  ulong local_190;
  Mat local_188;
  ulong local_140;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int iStack_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  undefined1 local_118 [16];
  long local_108;
  Allocator *local_100;
  long local_f8;
  void *local_f0;
  long local_e8;
  _func_int ***local_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  vector<int,_std::allocator<int>_> _space_ofs;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  local_138 = bottom_top_blob->w;
  local_1a8 = (ulong)(uint)bottom_top_blob->h;
  uVar39 = bottom_top_blob->c;
  uVar29 = (ulong)uVar39;
  _elemsize = bottom_top_blob->elemsize;
  local_188.cstep = 0;
  local_188.data = (Allocator *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize._0_4_ = 0;
  local_188.elempack = 0;
  local_188._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  iStack_134 = 0;
  local_188.elemsize._4_4_ = (int)local_188.refcount;
  local_188.allocator = (Allocator *)local_188.data;
  local_188.dims = (int)local_188.refcount;
  local_188.w = local_188.refcount._4_4_;
  local_188.c = local_188.elempack;
  Mat::create(&local_188,local_138,bottom_top_blob->h,uVar39,_elemsize,opt->workspace_allocator);
  iVar25 = -100;
  if (((Allocator *)local_188.data == (Allocator *)0x0) ||
     ((long)local_188.c * local_188.cstep == 0)) goto LAB_003485b3;
  uVar33 = (int)local_1a8 * local_138;
  if (0 < (int)uVar39) {
    uVar27 = 0;
    do {
      pfVar31 = (float *)(bottom_top_blob->cstep * uVar27 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var28 = (_func_int ***)
                  ((long)(_func_int ***)local_188.data +
                  local_188.cstep * uVar27 *
                  CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize));
      if ((int)uVar33 < 8) {
        uVar24 = 0;
      }
      else {
        iVar36 = 7;
        do {
          auVar64._4_4_ = pfVar31[1] * pfVar31[1];
          auVar64._0_4_ = *pfVar31 * *pfVar31;
          auVar64._8_4_ = pfVar31[2] * pfVar31[2];
          auVar64._12_4_ = pfVar31[3] * pfVar31[3];
          auVar64._16_4_ = pfVar31[4] * pfVar31[4];
          auVar64._20_4_ = pfVar31[5] * pfVar31[5];
          auVar64._24_4_ = pfVar31[6] * pfVar31[6];
          auVar64._28_4_ = pfVar31[7];
          *(undefined1 (*) [32])ppp_Var28 = auVar64;
          pfVar31 = pfVar31 + 8;
          ppp_Var28 = ppp_Var28 + 4;
          iVar36 = iVar36 + 8;
          uVar24 = uVar33 & 0xfffffff8;
        } while (iVar36 < (int)uVar33);
      }
      if (uVar33 - uVar24 != 0 && (int)uVar24 <= (int)uVar33) {
        lVar40 = 0;
        do {
          *(float *)((long)ppp_Var28 + lVar40 * 4) = pfVar31[lVar40] * pfVar31[lVar40];
          lVar40 = lVar40 + 1;
        } while (uVar33 - uVar24 != (int)lVar40);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar29);
  }
  local_140 = uVar29;
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_avx512[-3]) == 0) {
    local_1f8.cstep = 0;
    local_1f8.data = (void *)0x0;
    local_1f8.refcount._0_4_ = 0;
    local_1f8.refcount._4_4_ = 0;
    local_1f8.elemsize._0_4_ = 0;
    local_1f8.elemsize._4_4_ = 0;
    local_1f8.elempack = 0;
    local_1f8.allocator = (Allocator *)0x0;
    local_1f8.dims = 0;
    local_1f8.w = 0;
    local_1f8.h = 0;
    local_1f8.d = 0;
    local_1f8.c = 0;
    Mat::create(&local_1f8,local_138,(int)local_1a8,uVar39,_elemsize,opt->workspace_allocator);
    bVar23 = local_1f8.data == (void *)0x0 || (long)local_1f8.c * local_1f8.cstep == 0;
    if (bVar23) {
      piVar19 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1f8.cstep = 0;
      local_1f8.data = (void *)0x0;
      local_1f8.refcount._0_4_ = 0;
      local_1f8.refcount._4_4_ = 0;
      local_1f8.elemsize._0_4_ = 0;
      local_1f8.elemsize._4_4_ = 0;
      local_1f8.elempack = 0;
      local_1f8.dims = 0;
      local_1f8.w = 0;
      local_1f8.h = 0;
      local_1f8.d = 0;
      local_1f8.c = 0;
      goto LAB_003485b3;
    }
    local_198 = CONCAT71(local_198._1_7_,bVar23);
    if (0 < local_1f8.c * (int)local_1f8.cstep) {
      memset(local_1f8.data,0,(ulong)(uint)(local_1f8.c * (int)local_1f8.cstep) << 2);
    }
    if (0 < (int)uVar39) {
      local_78._4_4_ =
           *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx512[-3]) /
           (float)*(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx512[-3]);
      local_118 = ZEXT416((uint)local_78._4_4_);
      auVar81 = ZEXT1664(local_118);
      pp_Var1 = this->_vptr_LRN_x86_avx512;
      uVar27 = 0;
      auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      local_78._0_4_ = local_78._4_4_;
      fStack_70 = (float)local_78._4_4_;
      fStack_6c = (float)local_78._4_4_;
      fStack_68 = (float)local_78._4_4_;
      fStack_64 = (float)local_78._4_4_;
      fStack_60 = (float)local_78._4_4_;
      fStack_5c = (float)local_78._4_4_;
      local_1a8 = CONCAT44(local_1a8._4_4_,uVar33) & 0xfffffffffffffff8;
      uVar39 = uVar33 & 0xfffffff8;
      do {
        auVar85._8_4_ = 0x3f3504f3;
        auVar85._0_8_ = 0x3f3504f33f3504f3;
        auVar56._8_4_ = 0xffffff82;
        auVar56._0_8_ = 0xffffff82ffffff82;
        auVar84._8_4_ = 0x39506967;
        auVar84._0_8_ = 0x3950696739506967;
        auVar61._8_4_ = 0x3f800000;
        auVar61._0_8_ = 0x3f8000003f800000;
        auVar83._8_4_ = 0x3e2aaaaa;
        auVar83._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar82._8_4_ = 0x800000;
        auVar82._0_8_ = 0x80000000800000;
        auVar80._8_4_ = 0x3d2aa9c1;
        auVar80._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar79._8_4_ = 0x3c088908;
        auVar79._0_8_ = 0x3c0889083c088908;
        auVar78._8_4_ = 0x3ab743ce;
        auVar78._0_8_ = 0x3ab743ce3ab743ce;
        auVar76._8_4_ = 0x3fb8aa3b;
        auVar76._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar75._8_4_ = 0xc2b0c0a5;
        auVar75._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar73._8_4_ = 0x42b0c0a5;
        auVar73._0_8_ = 0x42b0c0a542b0c0a5;
        auVar85._12_4_ = 0x3f3504f3;
        auVar56._12_4_ = 0xffffff82;
        auVar84._12_4_ = 0x39506967;
        auVar61._12_4_ = 0x3f800000;
        auVar83._12_4_ = 0x3e2aaaaa;
        auVar82._12_4_ = 0x800000;
        auVar80._12_4_ = 0x3d2aa9c1;
        auVar79._12_4_ = 0x3c088908;
        auVar78._12_4_ = 0x3ab743ce;
        auVar76._12_4_ = 0x3fb8aa3b;
        auVar75._12_4_ = 0xc2b0c0a5;
        auVar73._12_4_ = 0x42b0c0a5;
        auVar85._16_4_ = 0x3f3504f3;
        auVar56._16_4_ = 0xffffff82;
        auVar84._16_4_ = 0x39506967;
        auVar61._16_4_ = 0x3f800000;
        auVar83._16_4_ = 0x3e2aaaaa;
        auVar82._16_4_ = 0x800000;
        auVar80._16_4_ = 0x3d2aa9c1;
        auVar79._16_4_ = 0x3c088908;
        auVar78._16_4_ = 0x3ab743ce;
        auVar76._16_4_ = 0x3fb8aa3b;
        auVar75._16_4_ = 0xc2b0c0a5;
        auVar73._16_4_ = 0x42b0c0a5;
        auVar85._20_4_ = 0x3f3504f3;
        auVar56._20_4_ = 0xffffff82;
        auVar84._20_4_ = 0x39506967;
        auVar61._20_4_ = 0x3f800000;
        auVar83._20_4_ = 0x3e2aaaaa;
        auVar82._20_4_ = 0x800000;
        auVar80._20_4_ = 0x3d2aa9c1;
        auVar79._20_4_ = 0x3c088908;
        auVar78._20_4_ = 0x3ab743ce;
        auVar76._20_4_ = 0x3fb8aa3b;
        auVar75._20_4_ = 0xc2b0c0a5;
        auVar73._20_4_ = 0x42b0c0a5;
        auVar85._24_4_ = 0x3f3504f3;
        auVar56._24_4_ = 0xffffff82;
        auVar84._24_4_ = 0x39506967;
        auVar61._24_4_ = 0x3f800000;
        auVar83._24_4_ = 0x3e2aaaaa;
        auVar82._24_4_ = 0x800000;
        auVar80._24_4_ = 0x3d2aa9c1;
        auVar79._24_4_ = 0x3c088908;
        auVar78._24_4_ = 0x3ab743ce;
        auVar76._24_4_ = 0x3fb8aa3b;
        auVar75._24_4_ = 0xc2b0c0a5;
        auVar73._24_4_ = 0x42b0c0a5;
        auVar85._28_4_ = 0x3f3504f3;
        auVar56._28_4_ = 0xffffff82;
        auVar84._28_4_ = 0x39506967;
        auVar61._28_4_ = 0x3f800000;
        auVar83._28_4_ = 0x3e2aaaaa;
        auVar82._28_4_ = 0x800000;
        auVar80._28_4_ = 0x3d2aa9c1;
        auVar79._28_4_ = 0x3c088908;
        auVar78._28_4_ = 0x3ab743ce;
        auVar76._28_4_ = 0x3fb8aa3b;
        auVar75._28_4_ = 0xc2b0c0a5;
        auVar73._28_4_ = 0x42b0c0a5;
        iVar25 = *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]) / 2;
        iVar36 = (int)uVar27;
        uVar24 = iVar36 - iVar25;
        if ((int)uVar24 <= iVar25 + iVar36) {
          do {
            if (uVar24 < (uint)uVar29) {
              ppp_Var28 = (_func_int ***)
                          ((long)(_func_int ***)local_188.data +
                          uVar24 * local_188.cstep *
                          CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize));
              pauVar32 = (undefined1 (*) [32])
                         (local_1f8.cstep * uVar27 *
                          CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize) +
                         (long)local_1f8.data);
              uVar37 = 0;
              if (7 < (int)uVar33) {
                iVar25 = 7;
                do {
                  auVar55._0_4_ = *(float *)*pauVar32 + *(float *)ppp_Var28;
                  auVar55._4_4_ = *(float *)(*pauVar32 + 4) + *(float *)((long)ppp_Var28 + 4);
                  auVar55._8_4_ = *(float *)(*pauVar32 + 8) + *(float *)(ppp_Var28 + 1);
                  auVar55._12_4_ =
                       *(float *)(*pauVar32 + 0xc) + *(float *)((long)(ppp_Var28 + 1) + 4);
                  auVar55._16_4_ = *(float *)(*pauVar32 + 0x10) + *(float *)(ppp_Var28 + 2);
                  auVar55._20_4_ =
                       *(float *)(*pauVar32 + 0x14) + *(float *)((long)(ppp_Var28 + 2) + 4);
                  auVar55._24_4_ = *(float *)(*pauVar32 + 0x18) + *(float *)(ppp_Var28 + 3);
                  auVar55._28_4_ =
                       *(float *)(*pauVar32 + 0x1c) + *(float *)((long)(ppp_Var28 + 3) + 4);
                  *pauVar32 = auVar55;
                  ppp_Var28 = ppp_Var28 + 4;
                  pauVar32 = pauVar32 + 1;
                  iVar25 = iVar25 + 8;
                  uVar37 = uVar39;
                } while (iVar25 < (int)uVar33);
              }
              if (uVar33 - uVar37 != 0 && (int)uVar37 <= (int)uVar33) {
                lVar40 = 0;
                do {
                  *(float *)(*pauVar32 + lVar40 * 4) =
                       *(float *)(*pauVar32 + lVar40 * 4) + *(float *)((long)ppp_Var28 + lVar40 * 4)
                  ;
                  lVar40 = lVar40 + 1;
                } while (uVar33 - uVar37 != (int)lVar40);
              }
            }
            bVar23 = (int)uVar24 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]) / 2 + iVar36;
            uVar24 = uVar24 + 1;
          } while (bVar23);
        }
        pauVar32 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar27 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        pauVar41 = (undefined1 (*) [32])
                   (local_1f8.cstep * uVar27 *
                    CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize) +
                   (long)local_1f8.data);
        uVar24 = 0;
        if (7 < (int)uVar33) {
          local_138 = *(int *)(&this->field_0xe0 + (long)pp_Var1[-3]);
          local_d8 = -*(float *)(&this->field_0xdc + (long)pp_Var1[-3]);
          iVar25 = 7;
          auVar55 = vmovdqa64_avx512vl(auVar61);
          auVar56 = vmovdqa64_avx512vl(auVar56);
          auVar57 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
          auVar61 = auVar79;
          do {
            auVar20._4_4_ = local_138;
            auVar20._0_4_ = local_138;
            auVar20._8_4_ = local_138;
            auVar20._12_4_ = local_138;
            auVar20._16_4_ = local_138;
            auVar20._20_4_ = local_138;
            auVar20._24_4_ = local_138;
            auVar20._28_4_ = local_138;
            auVar9 = vfmadd213ps_fma(*pauVar41,_local_78,auVar20);
            auVar58 = vmaxps_avx(auVar82,ZEXT1632(auVar9));
            auVar77 = vpsrld_avx2(auVar58,0x17);
            auVar58 = vpternlogd_avx512vl(auVar58,auVar45,auVar57,0xec);
            uVar29 = vcmpps_avx512vl(auVar58,auVar85,1);
            auVar59 = vaddps_avx512vl(auVar58,auVar46);
            auVar58 = vaddps_avx512vl(auVar59,auVar58);
            bVar23 = (bool)((byte)uVar29 & 1);
            auVar60._0_4_ = (float)((uint)bVar23 * auVar58._0_4_ | (uint)!bVar23 * auVar59._0_4_);
            bVar23 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar60._4_4_ = (float)((uint)bVar23 * auVar58._4_4_ | (uint)!bVar23 * auVar59._4_4_);
            bVar23 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar60._8_4_ = (float)((uint)bVar23 * auVar58._8_4_ | (uint)!bVar23 * auVar59._8_4_);
            bVar23 = (bool)((byte)(uVar29 >> 3) & 1);
            auVar60._12_4_ = (float)((uint)bVar23 * auVar58._12_4_ | (uint)!bVar23 * auVar59._12_4_)
            ;
            bVar23 = (bool)((byte)(uVar29 >> 4) & 1);
            auVar60._16_4_ = (float)((uint)bVar23 * auVar58._16_4_ | (uint)!bVar23 * auVar59._16_4_)
            ;
            bVar23 = (bool)((byte)(uVar29 >> 5) & 1);
            auVar60._20_4_ = (float)((uint)bVar23 * auVar58._20_4_ | (uint)!bVar23 * auVar59._20_4_)
            ;
            bVar23 = (bool)((byte)(uVar29 >> 6) & 1);
            auVar60._24_4_ = (float)((uint)bVar23 * auVar58._24_4_ | (uint)!bVar23 * auVar59._24_4_)
            ;
            bVar23 = SUB81(uVar29 >> 7,0);
            auVar60._28_4_ = (uint)bVar23 * auVar58._28_4_ | (uint)!bVar23 * auVar59._28_4_;
            auVar58._8_4_ = 0xbdebd1b8;
            auVar58._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar58._12_4_ = 0xbdebd1b8;
            auVar58._16_4_ = 0xbdebd1b8;
            auVar58._20_4_ = 0xbdebd1b8;
            auVar58._24_4_ = 0xbdebd1b8;
            auVar58._28_4_ = 0xbdebd1b8;
            auVar58 = vfmadd213ps_avx512vl(auVar48,auVar60,auVar58);
            auVar59._8_4_ = 0x3def251a;
            auVar59._0_8_ = 0x3def251a3def251a;
            auVar59._12_4_ = 0x3def251a;
            auVar59._16_4_ = 0x3def251a;
            auVar59._20_4_ = 0x3def251a;
            auVar59._24_4_ = 0x3def251a;
            auVar59._28_4_ = 0x3def251a;
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar60,auVar59);
            auVar12._8_4_ = 0xbdfe5d4f;
            auVar12._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar12._12_4_ = 0xbdfe5d4f;
            auVar12._16_4_ = 0xbdfe5d4f;
            auVar12._20_4_ = 0xbdfe5d4f;
            auVar12._24_4_ = 0xbdfe5d4f;
            auVar12._28_4_ = 0xbdfe5d4f;
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar60,auVar12);
            auVar44 = vfmadd213ps_fma(auVar58,auVar60,auVar49);
            auVar21._4_4_ = auVar60._4_4_ * auVar60._4_4_;
            auVar21._0_4_ = auVar60._0_4_ * auVar60._0_4_;
            auVar21._8_4_ = auVar60._8_4_ * auVar60._8_4_;
            auVar21._12_4_ = auVar60._12_4_ * auVar60._12_4_;
            auVar21._16_4_ = auVar60._16_4_ * auVar60._16_4_;
            auVar21._20_4_ = auVar60._20_4_ * auVar60._20_4_;
            auVar21._24_4_ = auVar60._24_4_ * auVar60._24_4_;
            auVar21._28_4_ = auVar61._28_4_;
            auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar44),auVar60,auVar50);
            auVar44 = vfmadd213ps_fma(auVar61,auVar60,auVar51);
            auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar44),auVar60,auVar52);
            auVar13._8_4_ = 0x3eaaaaaa;
            auVar13._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar13._12_4_ = 0x3eaaaaaa;
            auVar13._16_4_ = 0x3eaaaaaa;
            auVar13._20_4_ = 0x3eaaaaaa;
            auVar13._24_4_ = 0x3eaaaaaa;
            auVar13._28_4_ = 0x3eaaaaaa;
            auVar61 = vfmadd213ps_avx512vl(auVar61,auVar60,auVar13);
            auVar14._4_4_ = auVar60._4_4_ * auVar60._4_4_ * auVar60._4_4_ * auVar61._4_4_;
            auVar14._0_4_ = auVar60._0_4_ * auVar60._0_4_ * auVar60._0_4_ * auVar61._0_4_;
            auVar14._8_4_ = auVar60._8_4_ * auVar60._8_4_ * auVar60._8_4_ * auVar61._8_4_;
            auVar14._12_4_ = auVar60._12_4_ * auVar60._12_4_ * auVar60._12_4_ * auVar61._12_4_;
            auVar14._16_4_ = auVar60._16_4_ * auVar60._16_4_ * auVar60._16_4_ * auVar61._16_4_;
            auVar14._20_4_ = auVar60._20_4_ * auVar60._20_4_ * auVar60._20_4_ * auVar61._20_4_;
            auVar14._24_4_ = auVar60._24_4_ * auVar60._24_4_ * auVar60._24_4_ * auVar61._24_4_;
            auVar14._28_4_ = auVar61._28_4_;
            auVar61 = vpaddd_avx512vl(auVar77,auVar56);
            auVar61 = vcvtdq2ps_avx(auVar61);
            auVar58 = vsubps_avx512vl(auVar61,auVar47);
            bVar23 = (bool)((byte)uVar29 & 1);
            auVar62._0_4_ = (uint)bVar23 * auVar58._0_4_ | (uint)!bVar23 * auVar61._0_4_;
            bVar23 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar23 * auVar58._4_4_ | (uint)!bVar23 * auVar61._4_4_;
            bVar23 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar23 * auVar58._8_4_ | (uint)!bVar23 * auVar61._8_4_;
            bVar23 = (bool)((byte)(uVar29 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar23 * auVar58._12_4_ | (uint)!bVar23 * auVar61._12_4_;
            bVar23 = (bool)((byte)(uVar29 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar23 * auVar58._16_4_ | (uint)!bVar23 * auVar61._16_4_;
            bVar23 = (bool)((byte)(uVar29 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar23 * auVar58._20_4_ | (uint)!bVar23 * auVar61._20_4_;
            bVar23 = (bool)((byte)(uVar29 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar23 * auVar58._24_4_ | (uint)!bVar23 * auVar61._24_4_;
            bVar23 = SUB81(uVar29 >> 7,0);
            auVar62._28_4_ = (uint)bVar23 * auVar58._28_4_ | (uint)!bVar23 * auVar61._28_4_;
            auVar61 = vfmadd231ps_avx512vl(auVar14,auVar62,auVar53);
            auVar58 = vfmsub231ps_avx512vl(auVar61,auVar54,auVar21);
            uVar29 = vcmpps_avx512vl(ZEXT1632(auVar9),_DAT_00550320,2);
            auVar61 = vsubps_avx(auVar58,auVar60);
            auVar59 = vfmsub231ps_avx512vl(auVar61,auVar64,auVar62);
            auVar61 = vpcmpeqd_avx2(auVar58,auVar58);
            bVar23 = (bool)((byte)uVar29 & 1);
            bVar2 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar3 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar4 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar5 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar6 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar7 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar8 = SUB81(uVar29 >> 7,0);
            auVar77._4_4_ =
                 (float)((uint)bVar2 * auVar61._4_4_ | (uint)!bVar2 * auVar59._4_4_) * local_d8;
            auVar77._0_4_ =
                 (float)((uint)bVar23 * auVar61._0_4_ | (uint)!bVar23 * auVar59._0_4_) * local_d8;
            auVar77._8_4_ =
                 (float)((uint)bVar3 * auVar61._8_4_ | (uint)!bVar3 * auVar59._8_4_) * local_d8;
            auVar77._12_4_ =
                 (float)((uint)bVar4 * auVar61._12_4_ | (uint)!bVar4 * auVar59._12_4_) * local_d8;
            auVar77._16_4_ =
                 (float)((uint)bVar5 * auVar61._16_4_ | (uint)!bVar5 * auVar59._16_4_) * local_d8;
            auVar77._20_4_ =
                 (float)((uint)bVar6 * auVar61._20_4_ | (uint)!bVar6 * auVar59._20_4_) * local_d8;
            auVar77._24_4_ =
                 (float)((uint)bVar7 * auVar61._24_4_ | (uint)!bVar7 * auVar59._24_4_) * local_d8;
            auVar77._28_4_ = (uint)bVar8 * auVar61._28_4_ | (uint)!bVar8 * auVar59._28_4_;
            auVar61 = vminps_avx512vl(auVar77,auVar73);
            auVar61 = vmaxps_avx(auVar75,auVar61);
            auVar9 = vfmadd231ps_fma(auVar54,auVar61,auVar76);
            auVar58 = vroundps_avx(ZEXT1632(auVar9),1);
            uVar29 = vcmpps_avx512vl(ZEXT1632(auVar9),auVar58,1);
            auVar59 = vsubps_avx512vl(auVar58,auVar47);
            bVar23 = (bool)((byte)uVar29 & 1);
            auVar63._0_4_ = (float)((uint)bVar23 * auVar59._0_4_ | (uint)!bVar23 * auVar58._0_4_);
            bVar23 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar63._4_4_ = (float)((uint)bVar23 * auVar59._4_4_ | (uint)!bVar23 * auVar58._4_4_);
            bVar23 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar63._8_4_ = (float)((uint)bVar23 * auVar59._8_4_ | (uint)!bVar23 * auVar58._8_4_);
            bVar23 = (bool)((byte)(uVar29 >> 3) & 1);
            auVar63._12_4_ = (float)((uint)bVar23 * auVar59._12_4_ | (uint)!bVar23 * auVar58._12_4_)
            ;
            bVar23 = (bool)((byte)(uVar29 >> 4) & 1);
            auVar63._16_4_ = (float)((uint)bVar23 * auVar59._16_4_ | (uint)!bVar23 * auVar58._16_4_)
            ;
            bVar23 = (bool)((byte)(uVar29 >> 5) & 1);
            auVar63._20_4_ = (float)((uint)bVar23 * auVar59._20_4_ | (uint)!bVar23 * auVar58._20_4_)
            ;
            bVar23 = (bool)((byte)(uVar29 >> 6) & 1);
            auVar63._24_4_ = (float)((uint)bVar23 * auVar59._24_4_ | (uint)!bVar23 * auVar58._24_4_)
            ;
            bVar23 = SUB81(uVar29 >> 7,0);
            auVar63._28_4_ = (float)((uint)bVar23 * auVar59._28_4_ | (uint)!bVar23 * auVar58._28_4_)
            ;
            auVar61 = vfmsub231ps_avx512vl(auVar61,auVar63,auVar64);
            auVar61 = vfnmsub231ps_avx512vl(auVar61,auVar63,auVar53);
            auVar9 = vfmadd213ps_fma(auVar84,auVar61,auVar78);
            auVar15._4_4_ = auVar61._4_4_ * auVar61._4_4_;
            auVar15._0_4_ = auVar61._0_4_ * auVar61._0_4_;
            auVar15._8_4_ = auVar61._8_4_ * auVar61._8_4_;
            auVar15._12_4_ = auVar61._12_4_ * auVar61._12_4_;
            auVar15._16_4_ = auVar61._16_4_ * auVar61._16_4_;
            auVar15._20_4_ = auVar61._20_4_ * auVar61._20_4_;
            auVar15._24_4_ = auVar61._24_4_ * auVar61._24_4_;
            auVar15._28_4_ = auVar60._28_4_;
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar61,auVar79);
            auVar58 = vfmadd213ps_avx512vl(ZEXT1632(auVar9),auVar61,auVar80);
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar83);
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar54);
            auVar9 = vfmadd213ps_fma(auVar58,auVar15,auVar61);
            auVar74._0_4_ = (int)auVar63._0_4_;
            auVar74._4_4_ = (int)auVar63._4_4_;
            auVar74._8_4_ = (int)auVar63._8_4_;
            auVar74._12_4_ = (int)auVar63._12_4_;
            auVar74._16_4_ = (int)auVar63._16_4_;
            auVar74._20_4_ = (int)auVar63._20_4_;
            auVar74._24_4_ = (int)auVar63._24_4_;
            auVar74._28_4_ = (int)auVar63._28_4_;
            auVar61 = vpslld_avx2(auVar74,0x17);
            auVar61 = vpaddd_avx512vl(auVar61,auVar55);
            auVar16._4_4_ = auVar61._4_4_ * *(float *)((long)*pauVar32 + 4);
            auVar16._0_4_ = auVar61._0_4_ * *(float *)*pauVar32;
            auVar16._8_4_ = auVar61._8_4_ * *(float *)((long)*pauVar32 + 8);
            auVar16._12_4_ = auVar61._12_4_ * *(float *)((long)*pauVar32 + 0xc);
            auVar16._16_4_ = auVar61._16_4_ * *(float *)((long)*pauVar32 + 0x10);
            auVar16._20_4_ = auVar61._20_4_ * *(float *)((long)*pauVar32 + 0x14);
            auVar16._24_4_ = auVar61._24_4_ * *(float *)((long)*pauVar32 + 0x18);
            auVar16._28_4_ = auVar61._28_4_;
            auVar9 = vfmadd213ps_fma(auVar16,ZEXT1632(auVar9),auVar16);
            *pauVar32 = ZEXT1632(auVar9);
            pauVar41 = pauVar41 + 1;
            pauVar32 = pauVar32 + 1;
            iVar25 = iVar25 + 8;
            uVar24 = uVar39;
            iStack_134 = local_138;
            iStack_130 = local_138;
            iStack_12c = local_138;
            iStack_128 = local_138;
            iStack_124 = local_138;
            iStack_120 = local_138;
            iStack_11c = local_138;
            fStack_d4 = local_d8;
            fStack_d0 = local_d8;
            fStack_cc = local_d8;
            fStack_c8 = local_d8;
            fStack_c4 = local_d8;
            fStack_c0 = local_d8;
            fStack_bc = local_d8;
            auVar61 = auVar21;
          } while (iVar25 < (int)uVar33);
        }
        local_190 = uVar27;
        if (uVar33 - uVar24 != 0 && (int)uVar24 <= (int)uVar33) {
          lVar40 = 0;
          do {
            auVar9 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar41 + lVar40 * 4)),auVar81._0_16_,
                                     ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var1[-3])));
            fVar70 = powf(auVar9._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var1[-3]));
            auVar81 = ZEXT1664(local_118);
            *(float *)((long)*pauVar32 + lVar40 * 4) =
                 fVar70 * *(float *)((long)*pauVar32 + lVar40 * 4);
            lVar40 = lVar40 + 1;
          } while (uVar33 - uVar24 != (int)lVar40);
        }
        uVar27 = local_190 + 1;
        auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        uVar29 = local_140;
        uVar39 = (uint)local_1a8;
      } while (uVar27 != local_140);
    }
    piVar19 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
    iVar25 = -100;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_1f8.allocator == (Allocator *)0x0) {
          if (local_1f8.data != (void *)0x0) {
            free(local_1f8.data);
          }
        }
        else {
          (*(local_1f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1f8.cstep = 0;
    local_1f8.data = (void *)0x0;
    local_1f8.refcount._0_4_ = 0;
    local_1f8.refcount._4_4_ = 0;
    local_1f8.elemsize._0_4_ = 0;
    local_1f8.elemsize._4_4_ = 0;
    local_1f8.elempack = 0;
    local_1f8.dims = 0;
    local_1f8.w = 0;
    local_1f8.h = 0;
    local_1f8.d = 0;
    local_1f8.c = 0;
    if ((char)local_198 != '\0') goto LAB_003485b3;
  }
  else if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_avx512[-3]) == 1) {
    piVar19 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
    local_1f8.data = local_188.data;
    local_1f8.refcount._0_4_ = (int)local_188.refcount;
    local_1f8.refcount._4_4_ = local_188.refcount._4_4_;
    local_1f8.elemsize._0_4_ = (undefined4)local_188.elemsize;
    local_1f8.elemsize._4_4_ = local_188.elemsize._4_4_;
    local_1f8.elempack = local_188.elempack;
    local_1f8.allocator = local_188.allocator;
    local_1f8.dims = local_188.dims;
    local_1f8.w = local_188.w;
    local_1f8.h = local_188.h;
    local_1f8.d = local_188.d;
    local_1f8.c = local_188.c;
    local_1f8.cstep = local_188.cstep;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + 1;
      UNLOCK();
    }
    iVar36 = local_138;
    if (1 < (int)*(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx512[-3])) {
      uVar33 = *(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx512[-3]) >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar36 = ~uVar33 + *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx512[-3]);
      copy_make_border(&local_188,&local_1f8,uVar33,iVar36,uVar33,iVar36,0,0.0,(Option *)&_space_ofs
                      );
      iVar36 = local_1f8.w;
      if ((Allocator *)local_1f8.data == (Allocator *)0x0 ||
          (long)local_1f8.c * local_1f8.cstep == 0) {
        piVar19 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1f8.allocator == (Allocator *)0x0) {
              if ((Allocator *)local_1f8.data != (Allocator *)0x0) {
                free(local_1f8.data);
              }
            }
            else {
              (*(local_1f8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1f8.cstep = 0;
        local_1f8.data = (void *)0x0;
        local_1f8.refcount._0_4_ = 0;
        local_1f8.refcount._4_4_ = 0;
        local_1f8.elemsize._0_4_ = 0;
        local_1f8.elemsize._4_4_ = 0;
        local_1f8.elempack = 0;
        local_1f8.dims = 0;
        local_1f8.w = 0;
        local_1f8.h = 0;
        local_1f8.d = 0;
        local_1f8.c = 0;
        goto LAB_003485b3;
      }
    }
    local_d8 = *(float *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx512[-3]);
    uVar33 = (int)local_d8 * (int)local_d8;
    local_118._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx512[-3]);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar33,&local_1f9);
    piVar22 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var1 = this->_vptr_LRN_x86_avx512;
    iVar25 = *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]);
    if (0 < iVar25) {
      iVar26 = 0;
      iVar30 = 0;
      iVar35 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3])) {
          lVar40 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar35 + lVar40] = iVar30 + (int)lVar40;
            lVar40 = lVar40 + 1;
            iVar38 = (int)lVar40;
          } while (iVar38 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]));
          iVar35 = iVar35 + iVar38;
          iVar30 = iVar30 + iVar38;
        }
        iVar30 = iVar30 + (iVar36 - iVar25);
        iVar26 = iVar26 + 1;
      } while (iVar26 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]));
    }
    if (0 < (int)uVar39) {
      local_198 = (long)local_138;
      local_f0 = bottom_top_blob->data;
      local_f8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_100 = (Allocator *)local_1f8.data;
      local_108 = local_1f8.cstep *
                  CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize);
      local_e8 = (long)local_1f8.w *
                 CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize);
      auVar65 = vpbroadcastq_avx512f();
      local_190 = CONCAT44(local_190._4_4_,1.0 / (float)(int)uVar33);
      local_1a0 = 0;
      auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar81 = vmovdqu64_avx512f(auVar65);
      do {
        if (0 < (int)(uint)local_1a8) {
          local_e0 = (_func_int ***)((long)&local_100->_vptr_Allocator + local_108 * local_1a0);
          pvVar42 = (void *)(local_f8 * local_1a0 + (long)local_f0);
          pp_Var1 = this->_vptr_LRN_x86_avx512;
          local_208 = 0;
          do {
            ppp_Var28 = local_e0;
            if (0 < local_138) {
              lVar40 = local_e8 * local_208;
              lVar34 = 0;
              do {
                if (local_d8 == 0.0) {
                  fVar70 = 0.0;
                }
                else {
                  uVar29 = 0;
                  auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                  do {
                    auVar72 = auVar68;
                    auVar68 = vpbroadcastq_avx512f();
                    auVar69 = vporq_avx512f(auVar68,auVar66);
                    auVar68 = vporq_avx512f(auVar68,auVar67);
                    uVar10 = vpcmpuq_avx512f(auVar68,auVar65,2);
                    bVar17 = (byte)uVar10;
                    uVar10 = vpcmpuq_avx512f(auVar69,auVar65,2);
                    bVar18 = (byte)uVar10;
                    uVar43 = CONCAT11(bVar18,bVar17);
                    vmovdqu32_avx512f(*(undefined1 (*) [64])(piVar22 + uVar29));
                    auVar68 = vgatherdps_avx512f(*(undefined4 *)
                                                  ((long)ppp_Var28 +
                                                  uVar29 * 4 + lVar34 * 4 + lVar40));
                    auVar69._4_4_ = (uint)((byte)(uVar43 >> 1) & 1) * auVar68._4_4_;
                    auVar69._0_4_ = (uint)(bVar17 & 1) * auVar68._0_4_;
                    auVar69._8_4_ = (uint)((byte)(uVar43 >> 2) & 1) * auVar68._8_4_;
                    auVar69._12_4_ = (uint)((byte)(uVar43 >> 3) & 1) * auVar68._12_4_;
                    auVar69._16_4_ = (uint)((byte)(uVar43 >> 4) & 1) * auVar68._16_4_;
                    auVar69._20_4_ = (uint)((byte)(uVar43 >> 5) & 1) * auVar68._20_4_;
                    auVar69._24_4_ = (uint)((byte)(uVar43 >> 6) & 1) * auVar68._24_4_;
                    auVar69._28_4_ = (uint)((byte)(uVar43 >> 7) & 1) * auVar68._28_4_;
                    auVar69._32_4_ = (uint)(bVar18 & 1) * auVar68._32_4_;
                    auVar69._36_4_ = (uint)(bVar18 >> 1 & 1) * auVar68._36_4_;
                    auVar69._40_4_ = (uint)(bVar18 >> 2 & 1) * auVar68._40_4_;
                    auVar69._44_4_ = (uint)(bVar18 >> 3 & 1) * auVar68._44_4_;
                    auVar69._48_4_ = (uint)(bVar18 >> 4 & 1) * auVar68._48_4_;
                    auVar69._52_4_ = (uint)(bVar18 >> 5 & 1) * auVar68._52_4_;
                    auVar69._56_4_ = (uint)(bVar18 >> 6 & 1) * auVar68._56_4_;
                    auVar69._60_4_ = (uint)(bVar18 >> 7) * auVar68._60_4_;
                    auVar68 = vaddps_avx512f(auVar69,auVar72);
                    uVar29 = uVar29 + 0x10;
                  } while ((uVar33 + (uVar33 == 0) + 0xf & 0xfffffff0) != uVar29);
                  auVar65._0_4_ =
                       (uint)(bVar17 & 1) * auVar68._0_4_ |
                       (uint)!(bool)(bVar17 & 1) * auVar72._0_4_;
                  bVar23 = (bool)((byte)(uVar43 >> 1) & 1);
                  auVar65._4_4_ = (uint)bVar23 * auVar68._4_4_ | (uint)!bVar23 * auVar72._4_4_;
                  bVar23 = (bool)((byte)(uVar43 >> 2) & 1);
                  auVar65._8_4_ = (uint)bVar23 * auVar68._8_4_ | (uint)!bVar23 * auVar72._8_4_;
                  bVar23 = (bool)((byte)(uVar43 >> 3) & 1);
                  auVar65._12_4_ = (uint)bVar23 * auVar68._12_4_ | (uint)!bVar23 * auVar72._12_4_;
                  bVar23 = (bool)((byte)(uVar43 >> 4) & 1);
                  auVar65._16_4_ = (uint)bVar23 * auVar68._16_4_ | (uint)!bVar23 * auVar72._16_4_;
                  bVar23 = (bool)((byte)(uVar43 >> 5) & 1);
                  auVar65._20_4_ = (uint)bVar23 * auVar68._20_4_ | (uint)!bVar23 * auVar72._20_4_;
                  bVar23 = (bool)((byte)(uVar43 >> 6) & 1);
                  auVar65._24_4_ = (uint)bVar23 * auVar68._24_4_ | (uint)!bVar23 * auVar72._24_4_;
                  bVar23 = (bool)((byte)(uVar43 >> 7) & 1);
                  auVar65._28_4_ = (uint)bVar23 * auVar68._28_4_ | (uint)!bVar23 * auVar72._28_4_;
                  auVar65._32_4_ =
                       (uint)(bVar18 & 1) * auVar68._32_4_ |
                       (uint)!(bool)(bVar18 & 1) * auVar72._32_4_;
                  bVar23 = (bool)(bVar18 >> 1 & 1);
                  auVar65._36_4_ = (uint)bVar23 * auVar68._36_4_ | (uint)!bVar23 * auVar72._36_4_;
                  bVar23 = (bool)(bVar18 >> 2 & 1);
                  auVar65._40_4_ = (uint)bVar23 * auVar68._40_4_ | (uint)!bVar23 * auVar72._40_4_;
                  bVar23 = (bool)(bVar18 >> 3 & 1);
                  auVar65._44_4_ = (uint)bVar23 * auVar68._44_4_ | (uint)!bVar23 * auVar72._44_4_;
                  bVar23 = (bool)(bVar18 >> 4 & 1);
                  auVar65._48_4_ = (uint)bVar23 * auVar68._48_4_ | (uint)!bVar23 * auVar72._48_4_;
                  bVar23 = (bool)(bVar18 >> 5 & 1);
                  auVar65._52_4_ = (uint)bVar23 * auVar68._52_4_ | (uint)!bVar23 * auVar72._52_4_;
                  bVar23 = (bool)(bVar18 >> 6 & 1);
                  auVar65._56_4_ = (uint)bVar23 * auVar68._56_4_ | (uint)!bVar23 * auVar72._56_4_;
                  auVar65._60_4_ =
                       (uint)(bVar18 >> 7) * auVar68._60_4_ |
                       (uint)!(bool)(bVar18 >> 7) * auVar72._60_4_;
                  auVar64 = vextractf64x4_avx512f(auVar65,1);
                  auVar65 = vaddps_avx512f(auVar65,ZEXT3264(auVar64));
                  auVar44._0_4_ = auVar65._0_4_ + auVar65._16_4_;
                  auVar44._4_4_ = auVar65._4_4_ + auVar65._20_4_;
                  auVar44._8_4_ = auVar65._8_4_ + auVar65._24_4_;
                  auVar44._12_4_ = auVar65._12_4_ + auVar65._28_4_;
                  auVar9 = vshufpd_avx(auVar44,auVar44,1);
                  auVar71._0_4_ = auVar44._0_4_ + auVar9._0_4_;
                  auVar71._4_4_ = auVar44._4_4_ + auVar9._4_4_;
                  auVar71._8_4_ = auVar44._8_4_ + auVar9._8_4_;
                  auVar71._12_4_ = auVar44._12_4_ + auVar9._12_4_;
                  auVar9 = vhaddps_avx(auVar71,auVar71);
                  fVar70 = auVar9._0_4_;
                }
                auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar70 * (float)local_118._0_4_)),
                                         ZEXT416((uint)local_190),
                                         ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var1[-3])));
                auVar11._8_4_ = 0x80000000;
                auVar11._0_8_ = 0x8000000080000000;
                auVar11._12_4_ = 0x80000000;
                auVar44 = vxorps_avx512vl(ZEXT416(*(uint *)(&this->field_0xdc + (long)pp_Var1[-3])),
                                          auVar11);
                fVar70 = powf(auVar9._0_4_,auVar44._0_4_);
                *(float *)((long)pvVar42 + lVar34 * 4) =
                     fVar70 * *(float *)((long)pvVar42 + lVar34 * 4);
                lVar34 = lVar34 + 1;
                auVar65 = vmovdqu64_avx512f(auVar81);
                auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              } while (lVar34 != CONCAT44(iStack_134,local_138));
            }
            pvVar42 = (void *)((long)pvVar42 + local_198 * 4);
            local_208 = local_208 + 1;
          } while (local_208 != local_1a8);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_140);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar19 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_1f8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_1f8.data != (Allocator *)0x0) {
            free(local_1f8.data);
          }
        }
        else {
          (*(local_1f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1f8.cstep = 0;
    local_1f8.data = (void *)0x0;
    local_1f8.refcount._0_4_ = 0;
    local_1f8.refcount._4_4_ = 0;
    local_1f8.elemsize._0_4_ = 0;
    local_1f8.elemsize._4_4_ = 0;
    local_1f8.elempack = 0;
    local_1f8.dims = 0;
    local_1f8.w = 0;
    local_1f8.h = 0;
    local_1f8.d = 0;
    local_1f8.c = 0;
  }
  iVar25 = 0;
LAB_003485b3:
  piVar19 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_188.data != (Allocator *)0x0) {
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar25;
}

Assistant:

int LRN_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}